

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

void __thiscall Am_Priority_List::Print(Am_Priority_List *this,ostream *os)

{
  Am_Priority_List_Item *current;
  ostream *poVar1;
  Am_Priority_List_Item **ppAVar2;
  Am_Value v;
  Am_Value local_28;
  
  poVar1 = std::operator<<(os,"PRIORITY_LIST(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->number);
  std::operator<<(poVar1,") [");
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  ppAVar2 = &this->head;
  while (current = *ppAVar2, current != this->tail) {
    print_current(os,current);
    ppAVar2 = &current->next;
  }
  if (current != (Am_Priority_List_Item *)0x0) {
    print_current(os,current);
  }
  std::operator<<(os,"]");
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

void
Am_Priority_List::Print(std::ostream &os) const
{
  Am_Priority_List_Item *current;
  os << "PRIORITY_LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    print_current(os, current);
  }
  if (current) {
    print_current(os, current);
  }
  os << "]";
}